

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

int __thiscall Instance::init(Instance *this,EVP_PKEY_CTX *ctx)

{
  Instance *this_local;
  
  this->relax_domains = false;
  this->binary = false;
  this->method = -3;
  this->vtype = 'I';
  this->ndims = 0;
  this->m = 0;
  return (int)this;
}

Assistant:

void Instance::init() {
	relax_domains = false;
	binary = false;
	method = -3;
	vtype = 'I';
	ndims = 0;
	m = 0;
}